

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O3

void luaT_trybinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  int iVar1;
  Value in_RAX;
  char *msg;
  lua_Number dummy;
  Value local_28;
  
  local_28 = in_RAX;
  iVar1 = luaT_callbinTM(L,p1,p2,res,event);
  if (iVar1 != 0) {
    return;
  }
  if ((4 < event - TM_BAND) && (event != TM_BNOT)) {
    if (event == TM_CONCAT) {
      luaG_concaterror(L,p1,p2);
    }
    msg = "perform arithmetic on";
    goto LAB_00121f3f;
  }
  if (p1->tt_ == 3) {
    local_28 = p1->value_;
LAB_00121f01:
    if (p2->tt_ == 3) {
      local_28 = p2->value_;
LAB_00121f2a:
      luaG_tointerror(L,p1,p2);
    }
    iVar1 = luaV_tonumber_(p2,&local_28.n);
    if (iVar1 != 0) goto LAB_00121f2a;
  }
  else {
    iVar1 = luaV_tonumber_(p1,&local_28.n);
    if (iVar1 != 0) goto LAB_00121f01;
  }
  msg = "perform bitwise operation on";
LAB_00121f3f:
  luaG_opinterror(L,p1,p2,msg);
}

Assistant:

void luaT_trybinTM (lua_State *L, const TValue *p1, const TValue *p2,
                    StkId res, TMS event) {
  if (!callbinTM(L, p1, p2, res, event)) {
    switch (event) {
      case TM_BAND: case TM_BOR: case TM_BXOR:
      case TM_SHL: case TM_SHR: case TM_BNOT: {
        if (ttisnumber(p1) && ttisnumber(p2))
          luaG_tointerror(L, p1, p2);
        else
          luaG_opinterror(L, p1, p2, "perform bitwise operation on");
      }
      /* calls never return, but to avoid warnings: *//* FALLTHROUGH */
      default:
        luaG_opinterror(L, p1, p2, "perform arithmetic on");
    }
  }
}